

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O3

back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>
pstore::
diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
          (database *db,
          hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *index,revision_number old,
          back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> out)

{
  uint uVar1;
  typed_address<pstore::trailer> tVar2;
  traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  t;
  database *local_38;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  long local_28;
  
  if (old != 0xffffffff) {
    uVar1 = database::get_current_revision(db);
    if (old <= uVar1) {
      tVar2 = database::older_revision_footer_pos(db,old);
      local_28 = (long)tVar2.a_.a_ + 0x70;
      if ((index->root_).internal_ != (internal_node *)0x0) {
        local_38 = db;
        local_30 = index;
        out = diff_details::
              traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
              ::
              visit_node<std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                        ((traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
                          *)&local_38,index->root_,0,out);
      }
    }
  }
  return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
         out.container;
}

Assistant:

OutputIterator diff (database const & db, Index const & index, revision_number const old,
                         OutputIterator out) {
        if (old == pstore::head_revision || old > db.get_current_revision ()) {
            return out;
        }
        // addresses less than the threshold value are "old".
        diff_details::traverser<Index> t{db, index, (db.older_revision_footer_pos (old) + 1).to_address ()};
        return t (out);
    }